

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sstring_view.cpp
# Opt level: O0

void __thiscall
SStringViewInit_Short_Test<(anonymous_namespace)::string_maker<std::shared_ptr<const_char>_>_>::
TestBody(SStringViewInit_Short_Test<(anonymous_namespace)::string_maker<std::shared_ptr<const_char>_>_>
         *this)

{
  bool bVar1;
  shared_ptr<const_char> *ptr_00;
  char *pcVar2;
  const_iterator __first;
  const_iterator __last;
  size_t in_RCX;
  char *in_R9;
  AssertHelper local_180;
  Message local_178;
  int local_16c;
  difference_type local_168;
  undefined1 local_160 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_130;
  Message local_128;
  bool local_119;
  undefined1 local_118 [8];
  AssertionResult gtest_ar_;
  Message local_100;
  unsigned_long local_f8;
  size_type local_f0;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar_2;
  Message local_d0;
  uint local_c4;
  size_type local_c0;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar_1;
  Message local_a0;
  uint local_94;
  size_type local_90;
  undefined1 local_88 [8];
  AssertionResult gtest_ar;
  sstring_view<std::shared_ptr<const_char>_> sv;
  shared_ptr<const_char> ptr;
  allocator local_39;
  string local_38 [8];
  string src;
  TypeParam t;
  SStringViewInit_Short_Test<(anonymous_namespace)::string_maker<std::shared_ptr<const_char>_>_>
  *this_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"hello",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  anon_unknown.dwarf_e1429::string_maker<std::shared_ptr<const_char>_>::operator()
            ((string_maker<std::shared_ptr<const_char>_> *)&sv.size_,
             (string *)((long)&src.field_2 + 0xf));
  ptr_00 = (shared_ptr<const_char> *)std::__cxx11::string::length();
  (anonymous_namespace)::make_sstring_view<char_const>
            ((sstring_view<std::shared_ptr<const_char>_> *)&gtest_ar.message_,
             (_anonymous_namespace_ *)&sv.size_,ptr_00,in_RCX);
  local_90 = pstore::sstring_view<std::shared_ptr<const_char>_>::size
                       ((sstring_view<std::shared_ptr<const_char>_> *)&gtest_ar.message_);
  local_94 = 5;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_88,"sv.size ()","5U",&local_90,&local_94);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(&local_a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x72,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  local_c0 = pstore::sstring_view<std::shared_ptr<const_char>_>::length
                       ((sstring_view<std::shared_ptr<const_char>_> *)&gtest_ar.message_);
  local_c4 = 5;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_b8,"sv.length ()","5U",&local_c0,&local_c4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x73,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  local_f0 = pstore::sstring_view<std::shared_ptr<const_char>_>::max_size
                       ((sstring_view<std::shared_ptr<const_char>_> *)&gtest_ar.message_);
  local_f8 = std::numeric_limits<unsigned_long>::max();
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_e8,"sv.max_size ()","std::numeric_limits<std::size_t>::max ()",
             &local_f0,&local_f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
  if (!bVar1) {
    testing::Message::Message(&local_100);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x74,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
  local_119 = pstore::sstring_view<std::shared_ptr<const_char>_>::empty
                        ((sstring_view<std::shared_ptr<const_char>_> *)&gtest_ar.message_);
  local_119 = !local_119;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_118,&local_119,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
  if (!bVar1) {
    testing::Message::Message(&local_128);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_3.message_,(internal *)local_118,(AssertionResult *)"sv.empty ()"
               ,"true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x75,pcVar2);
    testing::internal::AssertHelper::operator=(&local_130,&local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
  __first = std::begin<pstore::sstring_view<std::shared_ptr<char_const>>>
                      ((sstring_view<std::shared_ptr<const_char>_> *)&gtest_ar.message_);
  __last = std::end<pstore::sstring_view<std::shared_ptr<char_const>>>
                     ((sstring_view<std::shared_ptr<const_char>_> *)&gtest_ar.message_);
  local_168 = std::distance<char_const*>(__first,__last);
  local_16c = 5;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_160,"std::distance (std::begin (sv), std::end (sv))","5",&local_168,
             &local_16c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
  if (!bVar1) {
    testing::Message::Message(&local_178);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_160);
    testing::internal::AssertHelper::AssertHelper
              (&local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x76,pcVar2);
    testing::internal::AssertHelper::operator=(&local_180,&local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_180);
    testing::Message::~Message(&local_178);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
  pstore::sstring_view<std::shared_ptr<const_char>_>::~sstring_view
            ((sstring_view<std::shared_ptr<const_char>_> *)&gtest_ar.message_);
  std::shared_ptr<const_char>::~shared_ptr((shared_ptr<const_char> *)&sv.size_);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

TYPED_TEST (SStringViewInit, Short) {
    using namespace pstore;
    TypeParam t;
    std::string const src{"hello"};
    auto ptr = t (src);
    auto sv = make_sstring_view (std::move (ptr), src.length ());
    EXPECT_EQ (sv.size (), 5U);
    EXPECT_EQ (sv.length (), 5U);
    EXPECT_EQ (sv.max_size (), std::numeric_limits<std::size_t>::max ());
    EXPECT_FALSE (sv.empty ());
    EXPECT_EQ (std::distance (std::begin (sv), std::end (sv)), 5);
}